

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

Aggregate * __thiscall
hta::Metric::aggregate_interval
          (Aggregate *__return_storage_ptr__,Metric *this,TimePoint begin,TimePoint end,
          Duration interval)

{
  bool bVar1;
  rep rVar2;
  rep rVar3;
  pointer pMVar4;
  reference pTVar5;
  TimeAggregate *r;
  iterator __end2;
  iterator __begin2;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *__range2;
  undefined1 local_50 [8];
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> rows;
  duration<long,_std::ratio<1L,_1000000000L>_> local_30;
  Metric *local_28;
  Metric *this_local;
  Duration interval_local;
  TimePoint end_local;
  TimePoint begin_local;
  
  local_28 = this;
  this_local = (Metric *)interval.__r;
  interval_local.__r =
       (rep)end.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r;
  end_local = begin;
  local_30.__r = (rep)std::chrono::
                      time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&end_local.
                                          super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        );
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_30);
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&this_local);
  if (rVar2 % rVar3 != 0) {
    __assert_fail("begin.time_since_epoch().count() % interval.count() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                  ,0x8f,"Aggregate hta::Metric::aggregate_interval(TimePoint, TimePoint, Duration)")
    ;
  }
  rows.super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::chrono::
                time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::
                time_since_epoch((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&interval_local);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                     &rows.
                      super__Vector_base<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000000L>_> *)&this_local);
  if (rVar2 % rVar3 != 0) {
    __assert_fail("end.time_since_epoch().count() % interval.count() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                  ,0x90,"Aggregate hta::Metric::aggregate_interval(TimePoint, TimePoint, Duration)")
    ;
  }
  bVar1 = std::chrono::operator<=
                    (&end_local.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     ,(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&interval_local);
  if (bVar1) {
    Aggregate::Aggregate(__return_storage_ptr__);
    bVar1 = std::chrono::operator<
                      (&end_local.
                        super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       ,(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)&interval_local);
    if (bVar1) {
      pMVar4 = std::unique_ptr<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>::
               operator->(&this->storage_metric_);
      (*pMVar4->_vptr_Metric[6])
                (local_50,pMVar4,
                 end_local.
                 super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                 .__d.__r,interval_local.__r,this_local,1);
      __end2 = std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::begin
                         ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)
                          local_50);
      r = (TimeAggregate *)
          std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::end
                    ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_50);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
                                         *)&r), bVar1) {
        pTVar5 = __gnu_cxx::
                 __normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
                 ::operator*(&__end2);
        Aggregate::operator+=(__return_storage_ptr__,pTVar5->aggregate);
        __gnu_cxx::
        __normal_iterator<hta::TimeAggregate_*,_std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>_>
        ::operator++(&__end2);
      }
      std::vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_>::~vector
                ((vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> *)local_50);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("begin <= end",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                ,0x91,"Aggregate hta::Metric::aggregate_interval(TimePoint, TimePoint, Duration)");
}

Assistant:

Aggregate Metric::aggregate_interval(TimePoint begin, TimePoint end, Duration interval)
{
    // We assume that timestamps provided are aligned and ordered
    // to ensure that everything pieces together exactly
    assert(begin.time_since_epoch().count() % interval.count() == 0);
    assert(end.time_since_epoch().count() % interval.count() == 0);
    assert(begin <= end);

    Aggregate aggregate;
    if (begin < end) // we can avoid creating empty vectors in this case
    {
        auto rows =
            storage_metric_->get(begin, end, interval, IntervalScope{ Scope::closed, Scope::open });
        for (const auto& r : rows)
        {
            aggregate += r.aggregate;
        }
    }
    return aggregate;
}